

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O1

int Ivy_ManLevels(Ivy_Man_t *p)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar2 = (long)p->vPos->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      uVar4 = *(uint *)((*(ulong *)((long)p->vPos->pArray[lVar3] + 0x10) & 0xfffffffffffffffe) + 8)
              >> 0xb;
      if (uVar1 <= uVar4) {
        uVar1 = uVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    return uVar1;
  }
  return 0;
}

Assistant:

int Ivy_ManLevels( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, LevelMax = 0;
    Ivy_ManForEachPo( p, pObj, i )
        LevelMax = IVY_MAX( LevelMax, (int)Ivy_ObjFanin0(pObj)->Level );
    return LevelMax;
}